

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogLocalResolveURI(void *catalogs,xmlChar *URI)

{
  xmlChar *ret;
  xmlCatalogEntryPtr catal;
  xmlChar *URI_local;
  void *catalogs_local;
  
  if (URI == (xmlChar *)0x0) {
    catalogs_local = (void *)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Resolve URI %s\n",URI);
    }
    if (catalogs == (void *)0x0) {
      catalogs_local = (void *)0x0;
    }
    else {
      catalogs_local = xmlCatalogListXMLResolveURI((xmlCatalogEntryPtr)catalogs,URI);
      if (((xmlChar *)catalogs_local == (xmlChar *)0x0) ||
         ((xmlChar *)catalogs_local == (xmlChar *)0xffffffffffffffff)) {
        catalogs_local = (void *)0x0;
      }
    }
  }
  return (xmlChar *)catalogs_local;
}

Assistant:

xmlChar *
xmlCatalogLocalResolveURI(void *catalogs, const xmlChar *URI) {
    xmlCatalogEntryPtr catal;
    xmlChar *ret;

    if (URI == NULL)
	return(NULL);

    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Resolve URI %s\n", URI);

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return(NULL);
    ret = xmlCatalogListXMLResolveURI(catal, URI);
    if ((ret != NULL) && (ret != XML_CATAL_BREAK))
	return(ret);
    return(NULL);
}